

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

int read_line_header_format_entries
              (backtrace_state *state,dwarf_data *ddata,unit *u,dwarf_buf *hdr_buf,line_header *hdr,
              size_t *pcount,char ***ppaths)

{
  byte *pbVar1;
  int iVar2;
  void *p;
  uint64_t uVar3;
  char **ppcVar4;
  size_t sVar5;
  char *pcVar6;
  uint64_t uVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  char local_178 [8];
  char b [200];
  ulong local_a8;
  char *local_90;
  char *path;
  uint64_t *local_80;
  uint64_t local_78;
  uint64_t local_70;
  char *local_68;
  dwarf_data *local_60;
  char *local_58;
  char **local_50;
  size_t local_48;
  line_header *local_40;
  backtrace_state *local_38;
  
  pbVar1 = hdr_buf->buf;
  local_80 = pcount;
  local_60 = ddata;
  local_40 = hdr;
  local_38 = state;
  iVar2 = advance(hdr_buf,1);
  if (iVar2 == 0) {
LAB_0013076d:
    uVar11 = 0;
    p = (void *)0x0;
  }
  else {
    uVar11 = (ulong)*pbVar1;
    if (uVar11 == 0) goto LAB_0013076d;
    p = tcmalloc_backtrace_alloc
                  (local_38,(ulong)((uint)*pbVar1 * 8),hdr_buf->error_callback,hdr_buf->data);
    if (p == (void *)0x0) {
      return 0;
    }
    uVar10 = 0;
    do {
      uVar3 = read_uleb128(hdr_buf);
      *(int *)((long)p + uVar10 * 8) = (int)uVar3;
      uVar3 = read_uleb128(hdr_buf);
      *(int *)((long)p + uVar10 * 8 + 4) = (int)uVar3;
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
  }
  uVar3 = read_uleb128(hdr_buf);
  if (uVar3 == 0) {
    *local_80 = 0;
    *ppaths = (char **)0x0;
    iVar2 = 1;
  }
  else {
    local_78 = uVar3;
    ppcVar4 = (char **)tcmalloc_backtrace_alloc
                                 (local_38,uVar3 * 8,hdr_buf->error_callback,hdr_buf->data);
    if (ppcVar4 != (char **)0x0) {
      path = (char *)&local_60->dwarf_sections;
      uVar7 = 0;
      local_50 = ppcVar4;
      do {
        local_90 = (char *)0x0;
        local_70 = uVar7;
        if (uVar11 == 0) {
LAB_001309c4:
          pcVar8 = hdr_buf->name;
          uVar9 = *(int *)&hdr_buf->buf - *(int *)&hdr_buf->start;
          pcVar6 = "missing file name in line number program header";
LAB_001309dd:
          snprintf(local_178,200,"%s in %s at %d",pcVar6,pcVar8,(ulong)uVar9);
          (*hdr_buf->error_callback)(hdr_buf->data,local_178,0);
LAB_001309ff:
          tcmalloc_backtrace_free(local_38,local_50,uVar3 * 8,hdr_buf->error_callback,hdr_buf->data)
          ;
          goto LAB_00130a1b;
        }
        uVar10 = 0;
        local_58 = (char *)0x0;
        do {
          iVar2 = read_attribute(*(dwarf_form *)((long)p + uVar10 * 8 + 4),0,hdr_buf,u->is_dwarf64,
                                 u->version,local_40->addrsize,(dwarf_sections *)path,
                                 local_60->altlink,(attr_val *)(b + 0xc0));
          if (iVar2 == 0) goto LAB_001309ff;
          iVar2 = *(int *)((long)p + uVar10 * 8);
          if (iVar2 == 1) {
            iVar2 = resolve_string((dwarf_sections *)path,u->is_dwarf64,local_60->is_bigendian,
                                   u->str_offsets_base,(attr_val *)(b + 0xc0),
                                   hdr_buf->error_callback,hdr_buf->data,&local_90);
            if (iVar2 == 0) goto LAB_001309ff;
          }
          else if ((iVar2 == 2) && (b._192_4_ == 3)) {
            if (local_40->dirs_count <= local_a8) {
              pcVar8 = hdr_buf->name;
              uVar9 = *(int *)&hdr_buf->buf - *(int *)&hdr_buf->start;
              pcVar6 = "invalid directory index in line number program header";
              goto LAB_001309dd;
            }
            local_58 = local_40->dirs[local_a8];
          }
          pcVar8 = local_90;
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
        if (local_90 == (char *)0x0) goto LAB_001309c4;
        if (local_58 != (char *)0x0) {
          local_48 = strlen(local_58);
          sVar5 = strlen(pcVar8);
          pcVar6 = (char *)tcmalloc_backtrace_alloc
                                     (local_38,local_48 + sVar5 + 2,hdr_buf->error_callback,
                                      hdr_buf->data);
          if (pcVar6 != (char *)0x0) {
            local_68 = pcVar6;
            memcpy(pcVar6,local_58,local_48);
            local_68[local_48] = '/';
            memcpy(local_68 + local_48 + 1,pcVar8,sVar5 + 1);
            pcVar8 = local_68;
            goto LAB_0013095e;
          }
          goto LAB_001309ff;
        }
LAB_0013095e:
        local_50[local_70] = pcVar8;
        uVar7 = local_70 + 1;
      } while (uVar7 != local_78);
      *local_80 = local_78;
      *ppaths = local_50;
      iVar2 = 1;
      goto LAB_00130a23;
    }
LAB_00130a1b:
    iVar2 = 0;
  }
  if (p == (void *)0x0) {
    return iVar2;
  }
LAB_00130a23:
  tcmalloc_backtrace_free
            (local_38,p,(ulong)(uint)((int)uVar11 << 3),hdr_buf->error_callback,hdr_buf->data);
  return iVar2;
}

Assistant:

static int
read_line_header_format_entries (struct backtrace_state *state,
				 struct dwarf_data *ddata,
				 struct unit *u,
				 struct dwarf_buf *hdr_buf,
				 struct line_header *hdr,
				 size_t *pcount,
				 const char ***ppaths)
{
  size_t formats_count;
  struct line_header_format *formats;
  size_t paths_count;
  const char **paths;
  size_t i;
  int ret;

  formats_count = read_byte (hdr_buf);
  if (formats_count == 0)
    formats = NULL;
  else
    {
      formats = ((struct line_header_format *)
		 backtrace_alloc (state,
				  (formats_count
				   * sizeof (struct line_header_format)),
				  hdr_buf->error_callback,
				  hdr_buf->data));
      if (formats == NULL)
	return 0;

      for (i = 0; i < formats_count; i++)
	{
	  formats[i].lnct = (int) read_uleb128(hdr_buf);
	  formats[i].form = (enum dwarf_form) read_uleb128 (hdr_buf);
	}
    }

  paths_count = read_uleb128 (hdr_buf);
  if (paths_count == 0)
    {
      *pcount = 0;
      *ppaths = NULL;
      ret = 1;
      goto exit;
    }

  paths = ((const char **)
	   backtrace_alloc (state, paths_count * sizeof (const char *),
			    hdr_buf->error_callback, hdr_buf->data));
  if (paths == NULL)
    {
      ret = 0;
      goto exit;
    }
  for (i = 0; i < paths_count; i++)
    {
      if (!read_lnct (state, ddata, u, hdr_buf, hdr, formats_count,
		      formats, &paths[i]))
	{
	  backtrace_free (state, paths,
			  paths_count * sizeof (const char *),
			  hdr_buf->error_callback, hdr_buf->data);
	  ret = 0;
	  goto exit;
	}
    }

  *pcount = paths_count;
  *ppaths = paths;

  ret = 1;

 exit:
  if (formats != NULL)
    backtrace_free (state, formats,
		    formats_count * sizeof (struct line_header_format),
		    hdr_buf->error_callback, hdr_buf->data);

  return  ret;
}